

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntermTraverse.cpp
# Opt level: O3

void __thiscall glslang::TIntermBranch::traverse(TIntermBranch *this,TIntermTraverser *it)

{
  pointer *pppTVar1;
  int iVar2;
  
  if ((it->preVisit == true) &&
     (iVar2 = (*it->_vptr_TIntermTraverser[9])(it,0,this), (char)iVar2 == '\0')) {
    return;
  }
  if (this->expression != (TIntermTyped *)0x0) {
    TIntermTraverser::incrementDepth(it,&this->super_TIntermNode);
    (*(this->expression->super_TIntermNode)._vptr_TIntermNode[2])(this->expression,it);
    it->depth = it->depth + -1;
    pppTVar1 = &(it->path).super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppTVar1 = *pppTVar1 + -1;
  }
  if (it->postVisit != true) {
    return;
  }
  (*it->_vptr_TIntermTraverser[9])(it,2,this);
  return;
}

Assistant:

void TIntermBranch::traverse(TIntermTraverser *it)
{
    bool visit = true;

    if (it->preVisit)
        visit = it->visitBranch(EvPreVisit, this);

    if (visit && expression) {
        it->incrementDepth(this);
        expression->traverse(it);
        it->decrementDepth();
    }

    if (visit && it->postVisit)
        it->visitBranch(EvPostVisit, this);
}